

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.cpp
# Opt level: O2

ElementSegment * __thiscall
wasm::ModuleUtils::copyElementSegment::anon_class_16_2_e16996e4::operator()
          (anon_class_16_2_e16996e4 *this,
          unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *ret)

{
  ElementSegment *pEVar1;
  pointer ppEVar2;
  char *pcVar3;
  int iVar4;
  Expression *in_RAX;
  undefined4 extraout_var;
  ElementSegment *pEVar5;
  pointer ppEVar6;
  Expression *local_38;
  
  pEVar5 = (ret->_M_t).
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
  pcVar3 = ((*this->segment)->super_Named).name.super_IString.str._M_str;
  *(size_t *)&(pEVar5->super_Named).name =
       ((*this->segment)->super_Named).name.super_IString.str._M_len;
  *(char **)((long)&(pEVar5->super_Named).name + 8) = pcVar3;
  pEVar5 = *this->segment;
  pEVar1 = (ret->_M_t).
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
  (pEVar1->super_Named).hasExplicitName = (pEVar5->super_Named).hasExplicitName;
  (pEVar1->type).id = (pEVar5->type).id;
  local_38 = in_RAX;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::reserve
            (&pEVar1->data,
             (long)(pEVar5->data).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar5->data).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  ppEVar2 = ((*this->segment)->data).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar6 = ((*this->segment)->data).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppEVar6 != ppEVar2; ppEVar6 = ppEVar6 + 1) {
    pEVar5 = (ret->_M_t).
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    iVar4 = ExpressionManipulator::copy((EVP_PKEY_CTX *)*ppEVar6,(EVP_PKEY_CTX *)this->out);
    local_38 = (Expression *)CONCAT44(extraout_var,iVar4);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pEVar5->data,
               &local_38);
  }
  pEVar5 = Module::addElementSegment(this->out,ret);
  return pEVar5;
}

Assistant:

ElementSegment* copyElementSegment(const ElementSegment* segment, Module& out) {
  auto copy = [&](std::unique_ptr<ElementSegment>&& ret) {
    ret->name = segment->name;
    ret->hasExplicitName = segment->hasExplicitName;
    ret->type = segment->type;
    ret->data.reserve(segment->data.size());
    for (auto* item : segment->data) {
      ret->data.push_back(ExpressionManipulator::copy(item, out));
    }

    return out.addElementSegment(std::move(ret));
  };

  if (segment->table.isNull()) {
    return copy(std::make_unique<ElementSegment>());
  } else {
    auto offset = ExpressionManipulator::copy(segment->offset, out);
    return copy(std::make_unique<ElementSegment>(segment->table, offset));
  }
}